

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::ShaderBuiltinConstantCase::iterate(ShaderBuiltinConstantCase *this)

{
  ShaderType SVar1;
  RenderContext *renderCtx;
  GetConstantValueFunc p_Var2;
  TestLog *this_00;
  int iVar3;
  Type TVar4;
  long *plVar5;
  ShaderExecutor *pSVar6;
  undefined4 extraout_var;
  TestError *this_01;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *description;
  bool bVar9;
  void *outputs;
  int result;
  ShaderSpec shaderSpec;
  string local_378;
  ShaderType local_354;
  VarType local_350;
  undefined2 local_338;
  undefined1 local_330 [8];
  undefined1 local_328 [24];
  undefined1 auStack_310 [16];
  undefined1 auStack_300 [40];
  Data local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  VarType local_190 [3];
  ios_base local_138 [264];
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  SVar1 = this->m_shaderType;
  local_330._0_4_ = 1;
  local_328._0_8_ = (pointer)0x0;
  local_328._8_8_ = (pointer)0x0;
  local_328._16_8_ = (pointer)0x0;
  auStack_310._0_8_ = (pointer)0x0;
  auStack_310._8_8_ = (pointer)0x0;
  auStack_300._0_8_ = (pointer)0x0;
  auStack_300._16_8_ = (char *)0x0;
  auStack_300[0x18] = '\0';
  local_2d8.array.elementType = (VarType *)&local_2c8;
  local_2d8._8_8_ = 0;
  local_2c8._M_local_buf[0] = '\0';
  local_350.m_data._8_8_ = 0x3d20746c75736572;
  local_338 = 0x20;
  local_350.m_data.basic.type = TYPE_FLOAT_MAT3;
  local_350.m_data.basic.precision = PRECISION_LOWP;
  local_350._0_8_ = (long)&local_350 + 0x10U;
  auStack_300._8_8_ = auStack_300 + 0x18;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_350,(ulong)(this->m_varName)._M_dataplus._M_p);
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_378.field_2._M_allocated_capacity = *psVar7;
    local_378.field_2._8_8_ = plVar5[3];
  }
  else {
    local_378.field_2._M_allocated_capacity = *psVar7;
    local_378._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_378._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_378);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar8) {
    local_1a0._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1a0._8_8_ = plVar5[3];
    local_1b0 = (undefined1  [8])&local_1a0;
  }
  else {
    local_1a0._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1b0 = (undefined1  [8])*plVar5;
  }
  local_1a8 = (_func_int **)plVar5[1];
  *plVar5 = (long)paVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_354 = SVar1;
  std::__cxx11::string::operator=((string *)&local_2d8.basic,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])&local_1a0) {
    operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
  }
  paVar8 = &local_378.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar8) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_350._0_8_ != (long)&local_350 + 0x10U) {
    operator_delete((void *)local_350._0_8_,local_350.m_data._8_8_ + 1);
  }
  local_378._M_string_length = 6;
  local_378.field_2._M_allocated_capacity._0_7_ = 0x746c75736572;
  local_378._M_dataplus._M_p = (pointer)paVar8;
  glu::VarType::VarType(&local_350,TYPE_INT,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol((Symbol *)local_1b0,&local_378,&local_350);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            ((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              *)auStack_310,(Symbol *)local_1b0);
  glu::VarType::~VarType(local_190);
  if (local_1b0 != (undefined1  [8])&local_1a0) {
    operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar8) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  pSVar6 = deqp::gls::ShaderExecUtil::createExecutor(renderCtx,local_354,(ShaderSpec *)local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.array.elementType != &local_2c8) {
    operator_delete(local_2d8.array.elementType,
                    CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)auStack_300._8_8_ != auStack_300 + 0x18) {
    operator_delete((void *)auStack_300._8_8_,CONCAT71(auStack_300._25_7_,auStack_300[0x18]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)auStack_310);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)local_328);
  p_Var2 = this->m_getValue;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  TVar4 = (*p_Var2)((Functions *)CONCAT44(extraout_var,iVar3));
  local_350.m_type = ~TYPE_BASIC;
  local_378._M_dataplus._M_p = (pointer)&local_350;
  iVar3 = (*pSVar6->_vptr_ShaderExecutor[2])(pSVar6);
  if ((char)iVar3 != '\0') {
    (*pSVar6->_vptr_ShaderExecutor[5])(pSVar6);
    (*pSVar6->_vptr_ShaderExecutor[6])(pSVar6,1,0,&local_378);
    this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_1b0 = (undefined1  [8])&local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1b3c1e9);
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_330,&this->m_varName,&this->m_varName,(string *)local_1b0,
               QP_KEY_TAG_NONE,(long)(int)local_350.m_type);
    tcu::TestLog::writeInteger
              (this_00,(char *)local_330,(char *)auStack_310._0_8_,(char *)auStack_300._16_8_,
               local_2d8.array.size,
               CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]));
    if ((undefined1 *)auStack_300._16_8_ != auStack_300 + 0x20) {
      operator_delete((void *)auStack_300._16_8_,auStack_300._32_8_ + 1);
    }
    if ((pointer)auStack_310._0_8_ != (pointer)auStack_300) {
      operator_delete((void *)auStack_310._0_8_,(ulong)(auStack_300._0_8_ + 1));
    }
    if (local_330 != (undefined1  [8])(local_328 + 8)) {
      operator_delete((void *)local_330,(ulong)(local_328._8_8_ + 1));
    }
    if (local_1b0 != (undefined1  [8])&local_1a0) {
      operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
    }
    bVar9 = local_350.m_type != TVar4;
    if (bVar9) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ERROR: Expected ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(this->m_varName)._M_dataplus._M_p,
                 (this->m_varName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," = ",3);
      std::ostream::operator<<((ostringstream *)&local_1a8,TVar4);
      local_330 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"Test shader:",0xc);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      (*pSVar6->_vptr_ShaderExecutor[3])
                (pSVar6,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      description = "Invalid builtin constant value";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar9,
               description);
    (*pSVar6->_vptr_ShaderExecutor[1])(pSVar6);
    return STOP;
  }
  (*pSVar6->_vptr_ShaderExecutor[3])
            (pSVar6,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
             ,0x8b);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ShaderBuiltinConstantCase::IterateResult ShaderBuiltinConstantCase::iterate (void)
{
	using namespace gls::ShaderExecUtil;

	const de::UniquePtr<ShaderExecutor>	shaderExecutor	(createGetConstantExecutor(m_context.getRenderContext(), m_shaderType, m_varName));
	const int							reference		= m_getValue(m_context.getRenderContext().getFunctions());
	int									result			= -1;
	void* const							outputs			= &result;

	if (!shaderExecutor->isOk())
	{
		shaderExecutor->log(m_testCtx.getLog());
		TCU_FAIL("Compile failed");
	}

	shaderExecutor->useProgram();
	shaderExecutor->execute(1, DE_NULL, &outputs);

	m_testCtx.getLog() << TestLog::Integer(m_varName, m_varName, "", QP_KEY_TAG_NONE, result);

	if (result != reference)
	{
		m_testCtx.getLog() << TestLog::Message << "ERROR: Expected " << m_varName << " = " << reference << TestLog::EndMessage
						   << TestLog::Message << "Test shader:" << TestLog::EndMessage;
		shaderExecutor->log(m_testCtx.getLog());
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid builtin constant value");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}